

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<int>::internalSetData<std::__cxx11::string>
          (Parameter<int> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  bool result;
  int tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  RepType local_14 [5];
  
  local_14[0] = 0;
  std::__cxx11::string::string((string *)&local_38,in_RSI);
  bVar1 = ParameterTraits<int>::convert<std::__cxx11::string>(&local_38,local_14);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x2c) = local_14[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }